

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = ptr[1];
  if (bVar1 - 0xd8 < 4) {
switchD_001583c0_caseD_7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
  }
  else if (3 < bVar1 - 0xdc) {
    if (bVar1 == 0) {
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      iVar4 = 0x16;
      switch(cVar2) {
      case '\x05':
        if ((long)end - (long)ptr < 2) {
          return -2;
        }
        break;
      case '\x06':
        if ((long)end - (long)ptr < 3) {
          return -2;
        }
        break;
      case '\a':
        goto switchD_001583c0_caseD_7;
      case '\b':
      case '\v':
      case '\f':
      case '\r':
      case '\x0e':
      case '\x0f':
      case '\x10':
      case '\x11':
      case '\x12':
      case '\x13':
      case '\x14':
      case '\x17':
        break;
      case '\t':
      case '\n':
      case '\x15':
        goto switchD_00158385_caseD_8;
      case '\x16':
      case '\x18':
        goto switchD_001583c0_caseD_16;
      default:
        if (cVar2 == '\x1e') goto switchD_00158385_caseD_8;
        if (cVar2 == '\x1d') goto LAB_00158297;
      }
    }
    else if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) {
LAB_00158297:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
           >> ((byte)*ptr & 0x1f) & 1) != 0) {
switchD_001583c0_caseD_16:
        lVar5 = (long)end - (long)ptr;
        ptr = ptr + 2;
        iVar3 = 0;
        while( true ) {
          lVar5 = lVar5 + -2;
          if (ptr == end) {
            return -1;
          }
          bVar1 = ((byte *)ptr)[1];
          iVar4 = iVar3;
          if (bVar1 == 0) break;
          if (bVar1 == 0xff) {
            if (0xfd < (byte)*ptr) goto switchD_00158385_caseD_8;
          }
          else {
            if (bVar1 - 0xd8 < 4) goto switchD_00158385_caseD_7;
            iVar4 = 0;
            if (bVar1 - 0xdc < 4) goto switchD_00158385_caseD_8;
          }
switchD_00158385_caseD_1d:
          iVar4 = 0;
          if ((*(uint *)((long)namingBitmap +
                        (ulong)((byte)*ptr >> 3 & 0x1c |
                               (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
               ((byte)*ptr & 0x1f) & 1) == 0) goto switchD_00158385_caseD_8;
switchD_00158385_caseD_16:
          ptr = (char *)((byte *)ptr + 2);
        }
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
        case 5:
          if (lVar5 < 2) {
            return -2;
          }
          goto switchD_00158385_caseD_8;
        case 6:
          if (lVar5 < 3) {
            return -2;
          }
          goto switchD_00158385_caseD_8;
        case 7:
switchD_00158385_caseD_7:
          if (lVar5 < 4) {
            return -2;
          }
        default:
          goto switchD_00158385_caseD_8;
        case 0x12:
          ptr = (char *)((byte *)ptr + 2);
          iVar4 = 0x1c;
          goto switchD_00158385_caseD_8;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_00158385_caseD_16;
        case 0x1d:
          goto switchD_00158385_caseD_1d;
        }
      }
    }
  }
  iVar4 = 0;
switchD_00158385_caseD_8:
  *nextTokPtr = ptr;
  return iVar4;
}

Assistant:

static
int PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}